

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorPicker::QColorPicker(QColorPicker *this,QWidget *parent)

{
  QFrame::QFrame(&this->super_QFrame,parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007ffcf8;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice =
       &PTR__QColorPicker_007ffeb0;
  QPixmap::QPixmap(&this->pix);
  this->crossVisible = true;
  this->hue = 0;
  this->sat = 0;
  setCol(this,0x96,0xff);
  QWidget::setAttribute((QWidget *)this,WA_NoSystemBackground,true);
  QWidget::setSizePolicy((QWidget *)this,(QSizePolicy)0x0);
  return;
}

Assistant:

QColorPicker::QColorPicker(QWidget* parent)
    : QFrame(parent)
    , crossVisible(true)
{
    hue = 0; sat = 0;
    setCol(150, 255);

    setAttribute(Qt::WA_NoSystemBackground);
    setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed) );
}